

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilerBuffer.cpp
# Opt level: O2

void __thiscall helics::ProfilerBuffer::writeFile(ProfilerBuffer *this)

{
  pointer pbVar1;
  ostream *poVar2;
  char *pcVar3;
  int *piVar4;
  error_code *peVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *m;
  pointer pbVar6;
  undefined1 auStack_238 [8];
  undefined4 local_230;
  undefined8 local_228;
  ofstream file;
  byte abStack_200 [480];
  
  std::ofstream::ofstream((string *)&file);
  std::ofstream::open((string *)&file,(int)this + (_S_out|_S_in));
  if ((abStack_200[*(long *)(_file + -0x18)] & 5) == 0) {
    std::ios::exceptions((int)auStack_238 + (int)*(long *)(_file + -0x18) + 0x18);
    pbVar1 = (this->mBuffers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (this->mBuffers).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      if (pbVar6->_M_string_length != 0) {
        poVar2 = std::operator<<((ostream *)&file,(string *)pbVar6);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      pbVar6->_M_string_length = 0;
      *(pbVar6->_M_dataplus)._M_p = '\0';
    }
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->mBuffers);
    std::ofstream::~ofstream(&file);
    return;
  }
  pcVar3 = (char *)__cxa_allocate_exception(0x20);
  piVar4 = __errno_location();
  peVar5 = (error_code *)strerror(*piVar4);
  local_228 = std::iostream_category();
  local_230 = 1;
  std::ios_base::failure[abi:cxx11]::failure(pcVar3,peVar5);
  __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

void ProfilerBuffer::writeFile()
{
    std::ofstream file;
    // can't enable exception now because of gcc bug that raises ios_base::failure with useless
    // message file.exceptions(file.exceptions() | std::ios::failbit);
    file.open(mFileName, std::ios::out | std::ios::app);
    if (file.fail()) {
        throw std::ios_base::failure(std::strerror(errno));
    }

    // make sure write fails with exception if something is wrong
    file.exceptions(file.exceptions() | std::ios::failbit | std::ifstream::badbit);

    for (auto& m : mBuffers) {
        if (!m.empty()) {
            file << m << std::endl;
        }
        m.clear();
    }
    mBuffers.clear();
}